

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

void ncnn::binary_op_scalar_inplace(Mat *a,float b,int op_type,Option *opt)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  float *ptr;
  int q;
  int size;
  int channels;
  Mat *m;
  int in_stack_fffffffffffffeb4;
  float *in_stack_fffffffffffffec8;
  int local_cc;
  
  lVar1 = in_RDI[7];
  for (local_cc = 0; local_cc < (int)lVar1; local_cc = local_cc + 1) {
    lVar2 = *in_RDI + in_RDI[8] * (long)local_cc * in_RDI[2];
    binary_op_vector((float *)&stack0xfffffffffffffee0,in_stack_fffffffffffffec8,
                     (float *)&stack0xfffffffffffffee0,(int)((ulong)lVar2 >> 0x20),(int)(float)lVar2
                     ,in_stack_fffffffffffffeb4,0,0);
  }
  return;
}

Assistant:

static void binary_op_scalar_inplace(Mat& bottom_top_blob, float b, int op_type, const Option& opt)
{
    if (op_type == BinaryOp::Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    // should never reach here
}